

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O0

double __thiscall aalcalc::calculateconfidenceinterval(aalcalc *this,double std_err)

{
  double dVar1;
  double z_value;
  double d [3];
  double c [3];
  double p_value;
  double std_err_local;
  aalcalc *this_local;
  
  dVar1 = log(1.0 - (double)(this->confidence_level_ + 1.0) / 2.0);
  dVar1 = sqrt(dVar1 * -2.0);
  return std_err * (dVar1 - ((dVar1 * 0.010328 + 0.802853) * dVar1 + 2.515517) /
                            (((dVar1 * 0.001308 + 0.189269) * dVar1 + 1.432788) * dVar1 + 1.0));
}

Assistant:

double aalcalc::calculateconfidenceinterval(const double std_err) {

	// Find p-value above 0.5
	// F^-1(p) = -G^-1(1-p)
	double p_value = (1 + confidence_level_) / 2.;
	p_value = sqrt(-2. * log(1 - p_value));

	// Approximation formula for z-value from Abramowitz & Stegun, Handbook
	// of Mathematical Functions: with Formulas, Graphs, and Mathematical
	// Tables, Dover Publications (1965), eq. 26.2.23
	// Also see John D. Cook Consulting, https://www.johndcook.com/blog/cpp_phi_inverse/
	double c[3] = { 2.515517, 0.802853, 0.010328 };
	double d[3] = { 1.432788, 0.189269, 0.001308 };
	double z_value = p_value - ((c[2] * p_value + c[1]) * p_value + c[0]) /
			 (((d[2] * p_value + d[1]) * p_value + d[0]) * p_value + 1.);
	return std_err * z_value;

}